

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

void parseHEXFile(filebuf *file)

{
  char cVar1;
  pointer paVar2;
  _Alloc_hider _Var3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint uVar10;
  void *pvVar11;
  uint uVar12;
  ushort uVar13;
  int iVar14;
  long lVar15;
  string line;
  ushort local_64;
  string local_60;
  uint local_3c;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_38;
  
  uVar12 = (uint)options.nbPalettes;
  uVar10 = (uint)options.nbColorsPerPal;
  local_38 = &options.palSpec;
  uVar13 = 0;
  do {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    readLine(file,&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
    local_64 = (ushort)(uVar12 * uVar10);
    if (local_60._M_string_length == 0) {
      iVar14 = 2;
    }
    else {
      if (local_60._M_string_length == 6) {
        lVar15 = 0;
        do {
          pvVar11 = memchr("0123456789ABCDEFabcdef",(int)_Var3._M_p[lVar15],0x16);
          if (pvVar11 == (void *)0x0) goto LAB_0010cd63;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 6);
        lVar15 = -1;
LAB_0010cd63:
        if (lVar15 == -1) {
          cVar1 = local_60._M_dataplus._M_p[1];
          uVar4 = nibble(*local_60._M_dataplus._M_p);
          uVar5 = nibble(cVar1);
          cVar1 = local_60._M_dataplus._M_p[3];
          uVar6 = nibble(local_60._M_dataplus._M_p[2]);
          uVar7 = nibble(cVar1);
          cVar1 = local_60._M_dataplus._M_p[5];
          uVar8 = nibble(local_60._M_dataplus._M_p[4]);
          uVar9 = nibble(cVar1);
          uVar13 = uVar13 + 1;
          if (uVar13 < local_64) {
            local_3c = (uint)uVar13;
            if (local_3c % (uint)options.nbColorsPerPal == 1) {
              if (options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                _M_realloc_insert<>(local_38,(iterator)
                                             options.palSpec.
                                             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
              }
              else {
                paVar2 = options.palSpec.
                         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                paVar2->_M_elems[0].red = '\0';
                paVar2->_M_elems[0].green = '\0';
                paVar2->_M_elems[0].blue = '\0';
                paVar2->_M_elems[0].alpha = '\0';
                paVar2->_M_elems[1].red = '\0';
                paVar2->_M_elems[1].green = '\0';
                paVar2->_M_elems[1].blue = '\0';
                paVar2->_M_elems[1].alpha = '\0';
                paVar2->_M_elems[2].red = '\0';
                paVar2->_M_elems[2].green = '\0';
                paVar2->_M_elems[2].blue = '\0';
                paVar2->_M_elems[2].alpha = '\0';
                paVar2->_M_elems[3].red = '\0';
                paVar2->_M_elems[3].green = '\0';
                paVar2->_M_elems[3].blue = '\0';
                paVar2->_M_elems[3].alpha = '\0';
                options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     options.palSpec.
                     super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems
            [(ulong)local_3c % (ulong)options.nbColorsPerPal] =
                 (Rgba)((uint)(byte)(uVar4 * '\x10' + uVar5) |
                        (uint)(byte)(uVar6 * '\x10' + uVar7) << 8 |
                        (uint)(byte)(uVar8 * '\x10' + uVar9) << 0x10 | 0xff000000);
          }
          iVar14 = 0;
          goto LAB_0010cea6;
        }
      }
      iVar14 = 1;
      error("Failed to parse color #%u (\"%s\"): invalid \"rrggbb\" line",(ulong)(uVar13 + 1),
            local_60._M_dataplus._M_p);
    }
LAB_0010cea6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    if (iVar14 != 0) {
      if ((iVar14 == 2) && (local_64 < uVar13)) {
        warning("HEX file contains %u colors, but there can only be %u; ignoring extra",
                (ulong)uVar13,(ulong)(uVar12 * uVar10));
      }
      return;
    }
  } while( true );
}

Assistant:

static void parseHEXFile(std::filebuf &file) {
	// https://lospec.com/palette-list/tag/gbc

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		std::string line;
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.length() != 6
		    || line.find_first_not_of("0123456789ABCDEFabcdef"sv) != std::string::npos) {
			error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid \"rrggbb\" line",
			      nbColors + 1, line.c_str());
			return;
		}

		Rgba color =
		    Rgba(toHex(line[0], line[1]), toHex(line[2], line[3]), toHex(line[4], line[5]), 0xFF);

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("HEX file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}